

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

int32_t difference_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  size_t __n;
  int32_t iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  uint16_t buffer [8];
  
  if (s_a == 0) {
    iVar8 = 0;
  }
  else {
    if (s_b != 0) {
      if (*A == 0) {
        if (*B == 0) {
          A = A + 1;
          s_a = s_a - 1;
          B = B + 1;
          s_b = s_b - 1;
          iVar17 = 0;
        }
        else {
          *C = 0;
          A = A + 1;
          s_a = s_a - 1;
          iVar17 = 1;
        }
      }
      else {
        iVar17 = 0;
        if (*B == 0) {
          B = B + 1;
          s_b = s_b - 1;
        }
      }
      uVar6 = s_a & 0xfffffffffffffff8;
      uVar15 = s_b & 0xfffffffffffffff8;
      if (uVar15 == 0 || uVar6 == 0) {
        uVar12 = 0;
        uVar16 = 0;
      }
      else {
        auVar3 = vlddqu_avx(*(undefined1 (*) [16])A);
        auVar18 = ZEXT1664(auVar3);
        auVar19 = ZEXT1664((undefined1  [16])0x0);
        uVar12 = 0;
        uVar16 = 0;
        pauVar7 = (undefined1 (*) [16])B;
        while( true ) {
          auVar3 = vlddqu_avx(*pauVar7);
          uVar2 = *(ushort *)(*(undefined1 (*) [16])B + uVar16 * 2 + 0xe);
          uVar10 = uVar12;
          do {
            vpcmpistrm_avx(auVar3,auVar18._0_16_,1);
            auVar4 = vpor_avx(auVar19._0_16_,in_ZMM0._0_16_);
            auVar19 = ZEXT1664(auVar4);
            uVar1 = *(ushort *)(*(undefined1 (*) [16])A + uVar10 * 2 + 0xe);
            uVar12 = uVar10;
            if (uVar1 <= uVar2) {
              uVar13 = auVar4._0_4_ ^ 0xff;
              auVar4 = vpshufb_avx(auVar18._0_16_,
                                   *(undefined1 (*) [16])(shuffle_mask16 + (long)(int)uVar13 * 0x10)
                                  );
              in_ZMM0 = ZEXT1664(auVar4);
              *(undefined1 (*) [16])(C + iVar17) = auVar4;
              iVar17 = iVar17 + POPCOUNT(uVar13);
              uVar12 = uVar6;
              if (uVar10 + 8 == uVar6) goto LAB_00103b9f;
              auVar4 = vlddqu_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])((long)A + 0x10) + uVar10 * 2));
              auVar18 = ZEXT1664(auVar4);
              auVar19 = ZEXT1664((undefined1  [16])0x0);
              uVar12 = uVar10 + 8;
            }
            uVar10 = uVar12;
          } while (uVar1 < uVar2);
          if (uVar16 + 8 == uVar15) break;
          pauVar7 = (undefined1 (*) [16])(*(undefined1 (*) [16])((long)B + 0x10) + uVar16 * 2);
          uVar16 = uVar16 + 8;
        }
        uVar16 = uVar15;
        if (uVar12 < uVar6) {
          buffer[0] = 0;
          buffer[1] = 0;
          buffer[2] = 0;
          buffer[3] = 0;
          buffer[4] = 0;
          buffer[5] = 0;
          buffer[6] = 0;
          buffer[7] = 0;
          memcpy(buffer,*(undefined1 (*) [16])B + uVar15 * 2,(ulong)((int)s_b * 2 & 0xe));
          auVar3 = vlddqu_avx((undefined1  [16])buffer);
          vpcmpistrm_avx(auVar3,auVar18._0_16_,1);
          auVar3 = vpor_avx(auVar3,auVar19._0_16_);
          uVar13 = auVar3._0_4_ ^ 0xff;
          auVar3 = vpshufb_avx(auVar18._0_16_,
                               *(undefined1 (*) [16])(shuffle_mask16 + (long)(int)uVar13 * 0x10));
          *(undefined1 (*) [16])(C + iVar17) = auVar3;
          iVar17 = iVar17 + POPCOUNT(uVar13);
          uVar12 = uVar12 + 8;
        }
      }
LAB_00103b9f:
      do {
        __n = s_a * 2 + uVar12 * -2;
        lVar14 = (long)iVar17;
        lVar11 = 0;
        while( true ) {
          uVar6 = uVar12 + lVar11;
          iVar9 = (int)lVar11;
          if ((s_a <= uVar6) || (s_b <= uVar16)) {
            if (uVar6 < s_a) {
              if (A == C) {
                if ((ulong)(lVar14 + lVar11) < uVar6) {
                  iVar5 = ((int)s_a - (int)uVar12) - iVar9;
                  memcpy(C + lVar14 + lVar11,*(undefined1 (*) [16])A + lVar11 * 2 + uVar12 * 2,__n);
                }
                else {
                  iVar5 = ((int)s_a - (int)uVar12) - iVar9;
                }
              }
              else {
                iVar5 = (int)(s_a - uVar12) - iVar9;
                for (; s_a - uVar12 != lVar11; lVar11 = lVar11 + 1) {
                  C[lVar14 + lVar11] =
                       *(uint16_t *)(*(undefined1 (*) [16])A + lVar11 * 2 + uVar12 * 2);
                }
              }
              return iVar9 + iVar5 + iVar17;
            }
            return iVar17 + iVar9;
          }
          uVar2 = *(ushort *)(*(undefined1 (*) [16])A + lVar11 * 2 + uVar12 * 2);
          if (*(ushort *)(*(undefined1 (*) [16])B + uVar16 * 2) < uVar2) goto LAB_00103bf6;
          if (*(ushort *)(*(undefined1 (*) [16])B + uVar16 * 2) <= uVar2) break;
          C[lVar14 + lVar11] = uVar2;
          lVar11 = lVar11 + 1;
          __n = __n - 2;
        }
        uVar6 = uVar12 + lVar11 + 1;
LAB_00103bf6:
        uVar12 = uVar6;
        uVar16 = uVar16 + 1;
        iVar17 = iVar17 + iVar9;
      } while( true );
    }
    if (A != C) {
      memcpy(C,A,s_a * 2);
    }
    iVar8 = (int32_t)s_a;
  }
  return iVar8;
}

Assistant:

int32_t difference_vector16(const uint16_t *__restrict__ A, size_t s_a,
                            const uint16_t *__restrict__ B, size_t s_b,
                            uint16_t *C) {
    // we handle the degenerate case
    if (s_a == 0) return 0;
    if (s_b == 0) {
        if (A != C) memcpy(C, A, sizeof(uint16_t) * s_a);
        return (int32_t)s_a;
    }
    // handle the leading zeroes, it is messy but it allows us to use the fast
    // _mm_cmpistrm instrinsic safely
    int32_t count = 0;
    if ((A[0] == 0) || (B[0] == 0)) {
        if ((A[0] == 0) && (B[0] == 0)) {
            A++;
            s_a--;
            B++;
            s_b--;
        } else if (A[0] == 0) {
            C[count++] = 0;
            A++;
            s_a--;
        } else {
            B++;
            s_b--;
        }
    }
    // at this point, we have two non-empty arrays, made of non-zero
    // increasing values.
    size_t i_a = 0, i_b = 0;
    const size_t vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    if ((i_a < st_a) && (i_b < st_b)) {  // this is the vectorized code path
        __m128i v_a, v_b;                //, v_bmax;
        // we load a vector from A and a vector from B
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        // we have a runningmask which indicates which values from A have been
        // spotted in B, these don't get written out.
        __m128i runningmask_a_found_in_b = _mm_setzero_si128();
        /****
         * start of the main vectorized loop
         *****/
        while (true) {
            // afoundinb will contain a mask indicate for each entry in A
            // whether it is seen
            // in B
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            // we always compare the last values of A and B
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                // Ok. In this code path, we are ready to write our v_a
                // because there is no need to read more from B, they will
                // all be large values.
                const int bitmask_belongs_to_difference =
                    _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
                /*** next few lines are probably expensive *****/
                __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                               bitmask_belongs_to_difference);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(bitmask_belongs_to_difference);
                // we advance a
                i_a += vectorlength;
                if (i_a == st_a)  // no more
                    break;
                runningmask_a_found_in_b = _mm_setzero_si128();
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                // in this code path, the current v_b has become useless
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        // at this point, either we have i_a == st_a, which is the end of the
        // vectorized processing,
        // or we have i_b == st_b,  and we are not done processing the vector...
        // so we need to finish it off.
        if (i_a < st_a) {        // we have unfinished business...
            uint16_t buffer[8];  // buffer to do a masked load
            memset(buffer, 0, 8 * sizeof(uint16_t));
            memcpy(buffer, B + i_b, (s_b - i_b) * sizeof(uint16_t));
            v_b = _mm_lddqu_si128((__m128i *)buffer);
            const __m128i a_found_in_b = _mm_cmpistrm(
                v_b, v_a,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            const int bitmask_belongs_to_difference =
                _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 +
                                           bitmask_belongs_to_difference);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(bitmask_belongs_to_difference);
            i_a += vectorlength;
        }
        // at this point we should have i_a == st_a and i_b == st_b
    }
    // do the tail using scalar code
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (b < a) {
            i_b++;
        } else if (a < b) {
            C[count] = a;
            count++;
            i_a++;
        } else {  //==
            i_a++;
            i_b++;
        }
    }
    if (i_a < s_a) {
        if (C == A) {
            assert((size_t)count <= i_a);
            if ((size_t)count < i_a) {
                memmove(C + count, A + i_a, sizeof(uint16_t) * (s_a - i_a));
            }
        } else {
            for (size_t i = 0; i < (s_a - i_a); i++) {
                C[count + i] = A[i + i_a];
            }
        }
        count += (int32_t)(s_a - i_a);
    }
    return count;
}